

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeparser.cpp
# Opt level: O2

string * __thiscall
stackjit::ByteCodeParser::currentTokenToLower_abi_cxx11_
          (string *__return_storage_ptr__,ByteCodeParser *this)

{
  size_t i;
  size_type sVar1;
  allocator local_39;
  string local_38;
  
  currentToken_abi_cxx11_(&local_38,this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_39);
  for (sVar1 = 0; local_38._M_string_length != sVar1; sVar1 = sVar1 + 1) {
    tolower((int)local_38._M_dataplus._M_p[sVar1]);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string ByteCodeParser::currentTokenToLower() const {
		return toLower(currentToken());
	}